

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O0

bool __thiscall CECorrections::LoadTtUt1(CECorrections *this)

{
  bool bVar1;
  size_type sVar2;
  istream *piVar3;
  reference pvVar4;
  long in_RDI;
  vector<double,_std::allocator<double>_> *__x;
  double dVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  exception *e;
  exception *e_2;
  exception *e_1;
  vector<double,_std::allocator<double>_> greg_vect;
  string line;
  double delt;
  int mjd;
  ifstream corrections_file;
  string url;
  bool loaded;
  value_type *in_stack_fffffffffffff9b8;
  string *in_stack_fffffffffffff9c0;
  allocator_type *in_stack_fffffffffffff9c8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9d0;
  size_type in_stack_fffffffffffff9d8;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e4;
  size_type in_stack_fffffffffffff9e8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9f0;
  string *in_stack_fffffffffffffa58;
  string *in_stack_fffffffffffffa60;
  CECorrections *in_stack_fffffffffffffa68;
  string local_580 [32];
  ifstream local_560 [520];
  double local_358;
  int local_34c;
  string local_340 [56];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [40];
  undefined8 local_2a0;
  vector<double,_std::allocator<double>_> local_298;
  string local_280 [32];
  vector<double,_std::allocator<double>_> *local_260;
  int local_254;
  istream local_250 [543];
  allocator local_31;
  string local_30 [39];
  byte local_9;
  
  local_9 = 1;
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf8));
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"http://maia.usno.navy.mil/ser7/deltat.data",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    LoadFile(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    std::vector<double,_std::allocator<double>_>::reserve
              (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    std::__cxx11::string::string(local_280);
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_250,local_280);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      local_2a0 = 0;
      std::allocator<double>::allocator((allocator<double> *)0x13115c);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0),
                 in_stack_fffffffffffff9d8,(value_type *)in_stack_fffffffffffff9d0,
                 in_stack_fffffffffffff9c8);
      std::allocator<double>::~allocator((allocator<double> *)0x13118a);
      std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_280);
      dVar5 = std::__cxx11::stod(in_stack_fffffffffffff9c0,(size_t *)in_stack_fffffffffffff9b8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_298,0);
      *pvVar4 = dVar5;
      std::__cxx11::string::~string(local_2c8);
      std::__cxx11::string::substr((ulong)local_2e8,(ulong)local_280);
      pvVar6 = (vector<double,_std::allocator<double>_> *)
               std::__cxx11::stod(in_stack_fffffffffffff9c0,(size_t *)in_stack_fffffffffffff9b8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_298,1);
      *pvVar4 = (value_type)pvVar6;
      std::__cxx11::string::~string(local_2e8);
      std::__cxx11::string::substr((ulong)local_308,(ulong)local_280);
      __x = (vector<double,_std::allocator<double>_> *)
            std::__cxx11::stod(in_stack_fffffffffffff9c0,(size_t *)in_stack_fffffffffffff9b8);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_298,2);
      *pvVar4 = (value_type)__x;
      std::__cxx11::string::~string(local_308);
      std::vector<double,_std::allocator<double>_>::vector(pvVar6,__x);
      dVar5 = CEDate::GregorianVect2MJD(in_stack_fffffffffffff9f0);
      local_254 = (int)dVar5;
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9d0);
      std::__cxx11::string::substr((ulong)local_340,(ulong)local_280);
      in_stack_fffffffffffff9f0 =
           (vector<double,_std::allocator<double>_> *)
           std::__cxx11::stod(in_stack_fffffffffffff9c0,(size_t *)in_stack_fffffffffffff9b8);
      local_260 = in_stack_fffffffffffff9f0;
      std::__cxx11::string::~string(local_340);
      local_358 = (double)local_254;
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9c0,
                 in_stack_fffffffffffff9b8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_fffffffffffff9d0,(value_type *)in_stack_fffffffffffff9c8);
      local_34c = 0;
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9d0);
    } while (local_34c == 0);
    std::ifstream::close();
    std::__cxx11::string::operator=(local_30,"http://maia.usno.navy.mil/ser7/deltat.preds");
    LoadFile(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    std::ifstream::operator=(local_250,local_560);
    std::ifstream::~ifstream(local_560);
    std::getline<char,std::char_traits<char>,std::allocator<char>>(local_250,local_280);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_250,local_280);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      std::__cxx11::string::substr((ulong)local_580,(ulong)local_280);
      local_254 = std::__cxx11::stoi(in_stack_fffffffffffff9c0,(size_t *)in_stack_fffffffffffff9b8,0
                                    );
      std::__cxx11::string::~string(local_580);
      dVar5 = (double)local_254;
      pvVar4 = std::vector<double,_std::allocator<double>_>::back
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9c0);
      if (*pvVar4 <= dVar5 && dVar5 != *pvVar4) {
        std::__cxx11::string::substr((ulong)&stack0xfffffffffffffa60,(ulong)local_280);
        pvVar6 = (vector<double,_std::allocator<double>_> *)
                 std::__cxx11::stod(in_stack_fffffffffffff9c0,(size_t *)in_stack_fffffffffffff9b8);
        local_260 = pvVar6;
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffa60);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9c0,
                   in_stack_fffffffffffff9b8);
        std::vector<double,_std::allocator<double>_>::push_back
                  (pvVar6,(value_type *)in_stack_fffffffffffff9c8);
      }
    }
    std::vector<double,_std::allocator<double>_>::shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)0x131878);
    std::vector<double,_std::allocator<double>_>::shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)0x13188e);
    std::__cxx11::string::~string(local_280);
    std::ifstream::~ifstream(local_250);
    std::__cxx11::string::~string(local_30);
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool CECorrections::LoadTtUt1(void) const
{
    bool loaded = true;
    if (ttut1_mjd_.size() == 0) {

        try{
            // Check if the file has been stored
            std::string   url = "http://maia.usno.navy.mil/ser7/deltat.data";
            std::ifstream corrections_file = LoadFile(ttut1_file_hist_, url);    
        
            // Allocate an approximate amount of memory for the values
            ttut1_mjd_.reserve(5000);

            // Preliminary storage values
            int    mjd;
            double delt;

            // Loop through each line of the file
            std::string line;
            while(std::getline(corrections_file, line)) {

                // Extract the Gregorian vector date
                std::vector<double> greg_vect(4, 0.0);
                greg_vect[0] = std::stod(line.substr(1,4));
                greg_vect[1] = std::stod(line.substr(6,2));
                greg_vect[2] = std::stod(line.substr(9,2));
                mjd = CEDate::GregorianVect2MJD(greg_vect);

                // Try to load delta T from the file
                try {
                    delt = std::stod(line.substr(13,7));
                } 
                // Otherwise load from bulletin A positions
                catch (std::exception& e) {
                    // Reached end of useable fields in the file
                    break;
                }

                // Store the values into a vector
                ttut1_mjd_.push_back( mjd );
                ttut1_delt_.push_back( delt );
            }

            // Close the corrections file
            corrections_file.close();

            // Load the predicted corrections for the future
            url = "http://maia.usno.navy.mil/ser7/deltat.preds";
            corrections_file = LoadFile(ttut1_file_pred_, url);

            // Loop through each line of the file
            std::getline(corrections_file, line);   // First line is a header
            while(std::getline(corrections_file, line)) {

                // Extract the MJD
                mjd = std::stoi(line.substr(3,9));

                // Only add this value if it is actually from a later date
                // than the last entry in the vector
                if (mjd > ttut1_mjd_.back()) {

                    // Try to load delta T from the file
                    try {
                        delt = std::stod(line.substr(24,5));
                    } 
                    // Otherwise load from bulletin A positions
                    catch (std::exception& e) {
                        // Reached end of useable fields in the file
                        break;
                    }

                    // Store the values into a vector
                    ttut1_mjd_.push_back( mjd );
                    ttut1_delt_.push_back( delt );
                }
            }

            // Shrink up the vectors so we dont take more memory than necessary
            ttut1_mjd_.shrink_to_fit();
            ttut1_delt_.shrink_to_fit();

        } catch (std::exception& e) {
            std::cerr << "ERROR Unable to load corrections from file" << std::endl;
            std::cerr << e.what() << std::endl;
            loaded = false;
        }
    }
    return loaded;
}